

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replistruct.cpp
# Opt level: O2

int __thiscall
r_comp::RepliStruct::clone
          (RepliStruct *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  long lVar1;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  void *__child_stack_00;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  Ptr arg;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_50;
  
  std::make_shared<r_comp::RepliStruct,r_comp::RepliStruct::Type_const&>(&this->type);
  std::__cxx11::string::_M_assign((string *)(*(long *)this + 8));
  std::__cxx11::string::_M_assign((string *)(*(long *)this + 0x48));
  std::__cxx11::string::_M_assign((string *)(*(long *)this + 0x28));
  lVar1 = *(long *)this;
  *(undefined8 *)(lVar1 + 200) = *(undefined8 *)(__fn + 200);
  std::__cxx11::string::_M_assign((string *)(lVar1 + 0x68));
  lVar1 = *(long *)this;
  *(undefined8 *)(lVar1 + 0xa8) = *(undefined8 *)(__fn + 0xa8);
  std::__cxx11::string::_M_assign((string *)(lVar1 + 0x88));
  p_Var2 = *(__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> **)(__fn + 0xb8);
  for (p_Var3 = *(__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> **)(__fn + 0xb0);
      p_Var3 != p_Var2; p_Var3 = p_Var3 + 1) {
    std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,p_Var3);
    lVar1 = *(long *)this;
    clone((RepliStruct *)&stack0xffffffffffffffc0,(__fn *)local_50._M_ptr,__child_stack_00,__flags,
          __arg);
    std::
    vector<std::shared_ptr<r_comp::RepliStruct>,std::allocator<std::shared_ptr<r_comp::RepliStruct>>>
    ::emplace_back<std::shared_ptr<r_comp::RepliStruct>>
              ((vector<std::shared_ptr<r_comp::RepliStruct>,std::allocator<std::shared_ptr<r_comp::RepliStruct>>>
                *)(lVar1 + 0xb0),(shared_ptr<r_comp::RepliStruct> *)&stack0xffffffffffffffc0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  }
  return (int)this;
}

Assistant:

RepliStruct::Ptr RepliStruct::clone() const
{
    RepliStruct::Ptr newStruct = std::make_shared<RepliStruct>(type);
    newStruct->cmd = cmd;
    newStruct->label = label;
    newStruct->tail = tail;
    newStruct->parent = parent;
    newStruct->error = error;
    newStruct->line = line;
    newStruct->fileName = fileName;

    for (RepliStruct::Ptr arg : args) {
        newStruct->args.push_back((arg)->clone());
    }

    return newStruct;
}